

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsondocument.cpp
# Opt level: O2

QJsonValue * __thiscall
QJsonDocument::operator[](QJsonValue *__return_storage_ptr__,QJsonDocument *this,qsizetype i)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  long in_FS_OFFSET;
  QCborArray local_40;
  QCborValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d)._M_t.
       super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
       super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl == (QJsonDocumentPrivate *)0x0) ||
     (*(Type *)((long)&(_Var1._M_head_impl)->value + 0x10) != Array)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QJsonValue::QJsonValue(__return_storage_ptr__,Undefined);
      return __return_storage_ptr__;
    }
  }
  else {
    QCborValue::toArray((QCborValue *)&local_40);
    QCborArray::at(&local_38,&local_40,i);
    QJsonPrivate::Value::fromTrustedCbor(__return_storage_ptr__,&local_38);
    QCborValue::~QCborValue((QCborValue *)&local_38);
    QCborArray::~QCborArray(&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

const QJsonValue QJsonDocument::operator[](qsizetype i) const
{
    if (!isArray())
        return QJsonValue(QJsonValue::Undefined);

    return QJsonPrivate::Value::fromTrustedCbor(d->value.toArray().at(i));
}